

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O2

array<unsigned_char,_4UL> PacketProcessor::ENumber(uint number,size_t *size)

{
  ulong uVar1;
  ulong uVar2;
  array<unsigned_char,_4UL> bytes;
  
  uVar1 = (ulong)number;
  bytes._M_elems[0] = 0xfe;
  bytes._M_elems[1] = 0xfe;
  bytes._M_elems[2] = 0xfe;
  bytes._M_elems[3] = 0xfe;
  if (number < 0xf71ae5) {
    if (0xfa08 < number) goto LAB_00166742;
    if (number < 0xfd) goto LAB_00166765;
  }
  else {
    uVar2 = uVar1 / 0xf71ae5;
    uVar1 = uVar1 % 0xf71ae5;
    bytes._M_elems = (_Type)((uint)(byte)((char)uVar2 + 1) << 0x18);
LAB_00166742:
    uVar2 = uVar1 / 0xfa09;
    uVar1 = uVar1 % 0xfa09;
    bytes._M_elems = (_Type)((uint)CONCAT11(bytes._M_elems[3],(char)uVar2 + '\x01') << 0x10);
  }
  bytes._M_elems =
       (_Type)((uint)CONCAT21(bytes._M_elems._2_2_,(char)((ushort)uVar1 / 0xfd) + '\x01') << 8);
  uVar1 = (ulong)(ushort)((ushort)uVar1 % 0xfd);
LAB_00166765:
  bytes._M_elems[0] = (char)uVar1 + '\x01';
  uVar1 = 4;
  do {
    uVar2 = uVar1;
    if ((int)uVar2 == 1) {
      uVar2 = 1;
      break;
    }
    uVar1 = uVar2 - 1;
  } while (bytes._M_elems[uVar2 - 1 & 0xffffffff] == '\0');
  *size = uVar2;
  return (array<unsigned_char,_4UL>)bytes._M_elems;
}

Assistant:

std::array<unsigned char, 4> PacketProcessor::ENumber(unsigned int number, std::size_t &size)
{
	std::array<unsigned char, 4> bytes{{254, 254, 254, 254}};
	unsigned int onumber = number;

	if (onumber >= PacketProcessor::MAX3)
	{
		bytes[3] = number / PacketProcessor::MAX3 + 1;
		number = number % PacketProcessor::MAX3;
	}

	if (onumber >= PacketProcessor::MAX2)
	{
		bytes[2] = number / PacketProcessor::MAX2 + 1;
		number = number % PacketProcessor::MAX2;
	}

	if (onumber >= PacketProcessor::MAX1)
	{
		bytes[1] = number / PacketProcessor::MAX1 + 1;
		number = number % PacketProcessor::MAX1;
	}

	bytes[0] = number + 1;

	for (int i = 3; i >= 0; --i)
	{
		if (i == 0)
		{
			size = 1;
			break;
		}
		else if (bytes[i] > 0)
		{
			size = i + 1;
			break;
		}
	}

	return bytes;
}